

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

void Cnf_SpecialDataLift(Cnf_Dat_t *p,int nVarsPlus,int firstPiVar,int lastPiVar)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (0 < p->nLiterals) {
    piVar2 = *p->pClauses;
    lVar4 = 0;
    do {
      iVar1 = piVar2[lVar4];
      iVar5 = iVar1 / 2;
      iVar3 = firstPiVar * -2;
      if (lastPiVar <= iVar5) {
        iVar3 = nVarsPlus * 2;
      }
      if (iVar5 < firstPiVar) {
        iVar3 = nVarsPlus * 2;
      }
      piVar2[lVar4] = iVar1 + iVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->nLiterals);
  }
  return;
}

Assistant:

void Cnf_SpecialDataLift( Cnf_Dat_t * p, int nVarsPlus, int firstPiVar, int lastPiVar)
{
    int v, var;
    for ( v = 0; v < p->nLiterals; v++ )
    {
        var = p->pClauses[0][v] / 2;
        if (var < firstPiVar || var >= lastPiVar)
            p->pClauses[0][v] += 2*nVarsPlus;
        else 
            p->pClauses[0][v] -= 2*firstPiVar;
    }
}